

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall cmExtraEclipseCDT4Generator::CreateProjectFile(cmExtraEclipseCDT4Generator *this)

{
  string *__lhs;
  cmLocalGenerator *this_00;
  cmMakefile *this_01;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  cmState *this_02;
  pointer pbVar5;
  allocator local_37a;
  allocator local_379;
  string sourceLinkedResourceName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraNatures;
  string make;
  string local_2f8;
  string makeArgs;
  string compilerId;
  string filename;
  cmGeneratedFileStream fout;
  
  this_00 = *(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  this_01 = this_00->Makefile;
  __lhs = &this->HomeOutputDirectory;
  std::operator+(&filename,__lhs,"/.project");
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,filename._M_dataplus._M_p,false);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) != 0) goto LAB_00399489;
  std::__cxx11::string::string((string *)&make,"CMAKE_C_COMPILER_ID",(allocator *)&makeArgs);
  pcVar2 = cmMakefile::GetSafeDefinition(this_01,&make);
  std::__cxx11::string::string((string *)&compilerId,pcVar2,(allocator *)&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&make);
  if (compilerId._M_string_length == 0) {
    std::__cxx11::string::string((string *)&make,"CMAKE_CXX_COMPILER_ID",(allocator *)&makeArgs);
    cmMakefile::GetSafeDefinition(this_01,&make);
    std::__cxx11::string::assign((char *)&compilerId);
    std::__cxx11::string::~string((string *)&make);
  }
  poVar3 = std::operator<<((ostream *)&fout,
                           "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<projectDescription>\n\t<name>"
                          );
  cmLocalGenerator::GetProjectName_abi_cxx11_(&makeArgs,this_00);
  std::__cxx11::string::string((string *)&extraNatures,"CMAKE_BUILD_TYPE",&local_37a);
  pcVar2 = cmMakefile::GetSafeDefinition(this_01,(string *)&extraNatures);
  std::__cxx11::string::string((string *)&sourceLinkedResourceName,pcVar2,&local_379);
  GetPathBasename(&local_2f8,__lhs);
  GenerateProjectName(&make,&makeArgs,&sourceLinkedResourceName,&local_2f8);
  poVar3 = std::operator<<(poVar3,(string *)&make);
  std::operator<<(poVar3,
                  "</name>\n\t<comment></comment>\n\t<projects>\n\t</projects>\n\t<buildSpec>\n\t\t<buildCommand>\n\t\t\t<name>org.eclipse.cdt.make.core.makeBuilder</name>\n\t\t\t<triggers>clean,full,incremental,</triggers>\n\t\t\t<arguments>\n"
                 );
  std::__cxx11::string::~string((string *)&make);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&extraNatures);
  std::__cxx11::string::~string((string *)&makeArgs);
  std::operator<<((ostream *)&fout,
                  "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.cleanBuildTarget</key>\n\t\t\t\t\t<value>clean</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableCleanBuild</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.append_environment</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.stopOnError</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n"
                 );
  std::__cxx11::string::string
            ((string *)&makeArgs,"CMAKE_MAKE_PROGRAM",(allocator *)&sourceLinkedResourceName);
  pcVar2 = cmMakefile::GetRequiredDefinition(this_01,&makeArgs);
  std::__cxx11::string::string((string *)&make,pcVar2,(allocator *)&extraNatures);
  std::__cxx11::string::~string((string *)&makeArgs);
  std::__cxx11::string::string
            ((string *)&sourceLinkedResourceName,"CMAKE_ECLIPSE_MAKE_ARGUMENTS",
             (allocator *)&extraNatures);
  pcVar2 = cmMakefile::GetSafeDefinition(this_01,&sourceLinkedResourceName);
  std::__cxx11::string::string((string *)&makeArgs,pcVar2,(allocator *)&local_2f8);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  poVar3 = std::operator<<((ostream *)&fout,
                           "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.enabledIncrementalBuild</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.command</key>\n\t\t\t\t\t<value>"
                          );
  std::__cxx11::string::string((string *)&sourceLinkedResourceName,(string *)&make);
  poVar3 = std::operator<<(poVar3,(string *)&sourceLinkedResourceName);
  poVar3 = std::operator<<(poVar3,
                           "</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.contents</key>\n\t\t\t\t\t<value>org.eclipse.cdt.make.core.activeConfigSettings</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.inc</key>\n\t\t\t\t\t<value>all</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.arguments</key>\n\t\t\t\t\t<value>"
                          );
  poVar3 = std::operator<<(poVar3,(string *)&makeArgs);
  poVar3 = std::operator<<(poVar3,
                           "</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.buildLocation</key>\n\t\t\t\t\t<value>"
                          );
  std::__cxx11::string::string((string *)&extraNatures,(string *)__lhs);
  poVar3 = std::operator<<(poVar3,(string *)&extraNatures);
  std::operator<<(poVar3,
                  "</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.useDefaultBuildCmd</key>\n\t\t\t\t\t<value>false</value>\n\t\t\t\t</dictionary>\n"
                 );
  std::__cxx11::string::~string((string *)&extraNatures);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  std::operator<<((ostream *)&fout,
                  "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.environment</key>\n\t\t\t\t\t<value>VERBOSE=1|CMAKE_NO_VERBOSE=1|"
                 );
  bVar1 = std::operator==(&compilerId,"MSVC");
  if (bVar1) {
    AddEnvVar(&fout,"PATH",this_00);
    AddEnvVar(&fout,"INCLUDE",this_00);
    AddEnvVar(&fout,"LIB",this_00);
    pcVar2 = "LIBPATH";
LAB_003990b7:
    AddEnvVar(&fout,pcVar2,this_00);
  }
  else {
    bVar1 = std::operator==(&compilerId,"Intel");
    if (bVar1) {
      pcVar2 = "INTEL_LICENSE_FILE";
      goto LAB_003990b7;
    }
  }
  std::operator<<((ostream *)&fout,"</value>\n\t\t\t\t</dictionary>\n");
  poVar3 = std::operator<<((ostream *)&fout,
                           "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableFullBuild</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.auto</key>\n\t\t\t\t\t<value>all</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableAutoBuild</key>\n\t\t\t\t\t<value>false</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.clean</key>\n\t\t\t\t\t<value>clean</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.fullBuildTarget</key>\n\t\t\t\t\t<value>all</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.buildArguments</key>\n\t\t\t\t\t<value></value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.location</key>\n\t\t\t\t\t<value>"
                          );
  std::__cxx11::string::string((string *)&sourceLinkedResourceName,(string *)__lhs);
  poVar3 = std::operator<<(poVar3,(string *)&sourceLinkedResourceName);
  std::operator<<(poVar3,
                  "</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.autoBuildTarget</key>\n\t\t\t\t\t<value>all</value>\n\t\t\t\t</dictionary>\n"
                 );
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  std::operator<<((ostream *)&fout,
                  "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.core.errorOutputParser</key>\n\t\t\t\t\t<value>"
                 );
  bVar1 = std::operator==(&compilerId,"MSVC");
  if (bVar1) {
    pcVar2 = "org.eclipse.cdt.core.VCErrorParser;";
LAB_0039917d:
    std::operator<<((ostream *)&fout,pcVar2);
  }
  else {
    bVar1 = std::operator==(&compilerId,"Intel");
    if (bVar1) {
      pcVar2 = "org.eclipse.cdt.core.ICCErrorParser;";
      goto LAB_0039917d;
    }
  }
  pcVar2 = "org.eclipse.cdt.core.MakeErrorParser;";
  if (this->SupportsGmakeErrorParser != false) {
    pcVar2 = "org.eclipse.cdt.core.GmakeErrorParser;";
  }
  std::operator<<((ostream *)&fout,pcVar2);
  std::operator<<((ostream *)&fout,
                  "org.eclipse.cdt.core.GCCErrorParser;org.eclipse.cdt.core.GASErrorParser;org.eclipse.cdt.core.GLDErrorParser;</value>\n\t\t\t\t</dictionary>\n"
                 );
  std::operator<<((ostream *)&fout,
                  "\t\t\t</arguments>\n\t\t</buildCommand>\n\t\t<buildCommand>\n\t\t\t<name>org.eclipse.cdt.make.core.ScannerConfigBuilder</name>\n\t\t\t<arguments>\n\t\t\t</arguments>\n\t\t</buildCommand>\n\t</buildSpec>\n"
                 );
  std::operator<<((ostream *)&fout,
                  "\t<natures>\n\t\t<nature>org.eclipse.cdt.make.core.makeNature</nature>\n\t\t<nature>org.eclipse.cdt.make.core.ScannerConfigNature</nature>\n"
                 );
  for (p_Var4 = (this->Natures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->Natures)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::operator<<((ostream *)&fout,"\t\t<nature>");
    poVar3 = std::operator<<(poVar3,(string *)(p_Var4 + 1));
    std::operator<<(poVar3,"</nature>\n");
  }
  this_02 = cmMakefile::GetState(this_01);
  std::__cxx11::string::string
            ((string *)&sourceLinkedResourceName,"ECLIPSE_EXTRA_NATURES",(allocator *)&extraNatures)
  ;
  pcVar2 = cmState::GetGlobalProperty(this_02,&sourceLinkedResourceName);
  std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  if (pcVar2 != (char *)0x0) {
    extraNatures.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extraNatures.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    extraNatures.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&sourceLinkedResourceName,pcVar2,(allocator *)&local_2f8)
    ;
    cmSystemTools::ExpandListArgument(&sourceLinkedResourceName,&extraNatures,false);
    std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
    for (pbVar5 = extraNatures.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 != extraNatures.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
      poVar3 = std::operator<<((ostream *)&fout,"\t\t<nature>");
      poVar3 = std::operator<<(poVar3,(string *)pbVar5);
      std::operator<<(poVar3,"</nature>\n");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&extraNatures);
  }
  std::operator<<((ostream *)&fout,"\t</natures>\n");
  std::operator<<((ostream *)&fout,"\t<linkedResources>\n");
  if (this->IsOutOfSourceBuild == true) {
    std::__cxx11::string::string
              ((string *)&sourceLinkedResourceName,"[Source directory]",(allocator *)&extraNatures);
    pcVar2 = cmLocalGenerator::GetCurrentSourceDirectory(this_00);
    std::__cxx11::string::string((string *)&local_2f8,pcVar2,&local_37a);
    std::__cxx11::string::string((string *)&extraNatures,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    bVar1 = cmsys::SystemTools::IsSubDirectory(__lhs,(string *)&extraNatures);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_2f8,(string *)&extraNatures);
      AppendLinkedResource(&fout,&sourceLinkedResourceName,&local_2f8,LinkToFolder);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->SrcLinkedResources,&sourceLinkedResourceName);
    }
    std::__cxx11::string::~string((string *)&extraNatures);
    std::__cxx11::string::~string((string *)&sourceLinkedResourceName);
  }
  if (this->SupportsVirtualFolders == true) {
    CreateLinksToSubprojects(this,&fout,__lhs);
    CreateLinksForTargets(this,&fout);
  }
  std::operator<<((ostream *)&fout,"\t</linkedResources>\n");
  std::operator<<((ostream *)&fout,"</projectDescription>\n");
  std::__cxx11::string::~string((string *)&makeArgs);
  std::__cxx11::string::~string((string *)&make);
  std::__cxx11::string::~string((string *)&compilerId);
LAB_00399489:
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateProjectFile()
{
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  cmMakefile* mf = lg->GetMakefile();

  const std::string filename = this->HomeOutputDirectory + "/.project";

  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  std::string compilerId = mf->GetSafeDefinition("CMAKE_C_COMPILER_ID");
  if (compilerId.empty())  // no C compiler, try the C++ compiler:
    {
    compilerId = mf->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
    }

  fout <<
    "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
    "<projectDescription>\n"
    "\t<name>" <<
    this->GenerateProjectName(lg->GetProjectName(),
                              mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
                              this->GetPathBasename(this->HomeOutputDirectory))
    << "</name>\n"
    "\t<comment></comment>\n"
    "\t<projects>\n"
    "\t</projects>\n"
    "\t<buildSpec>\n"
    "\t\t<buildCommand>\n"
    "\t\t\t<name>org.eclipse.cdt.make.core.makeBuilder</name>\n"
    "\t\t\t<triggers>clean,full,incremental,</triggers>\n"
    "\t\t\t<arguments>\n"
    ;

  // use clean target
  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.cleanBuildTarget</key>\n"
    "\t\t\t\t\t<value>clean</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableCleanBuild</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.append_environment</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.stopOnError</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  // set the make command
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string makeArgs = mf->GetSafeDefinition(
                                               "CMAKE_ECLIPSE_MAKE_ARGUMENTS");

  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.enabledIncrementalBuild</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.command</key>\n"
    "\t\t\t\t\t<value>" << this->GetEclipsePath(make) << "</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.contents</key>\n"
    "\t\t\t\t\t<value>org.eclipse.cdt.make.core.activeConfigSettings</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.inc</key>\n"
    "\t\t\t\t\t<value>all</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.arguments</key>\n"
    "\t\t\t\t\t<value>" << makeArgs << "</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.buildLocation</key>\n"
    "\t\t\t\t\t<value>"
     << this->GetEclipsePath(this->HomeOutputDirectory) << "</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.useDefaultBuildCmd</key>\n"
    "\t\t\t\t\t<value>false</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  // set project specific environment
  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.environment</key>\n"
    "\t\t\t\t\t<value>VERBOSE=1|CMAKE_NO_VERBOSE=1|"  //verbose Makefile output
    ;
  // set vsvars32.bat environment available at CMake time,
  //   but not necessarily when eclipse is open
  if (compilerId == "MSVC")
    {
    AddEnvVar(fout, "PATH", lg);
    AddEnvVar(fout, "INCLUDE", lg);
    AddEnvVar(fout, "LIB", lg);
    AddEnvVar(fout, "LIBPATH", lg);
    }
  else if (compilerId == "Intel")
    {
    // if the env.var is set, use this one and put it in the cache
    // if the env.var is not set, but the value is in the cache,
    // use it from the cache:
    AddEnvVar(fout, "INTEL_LICENSE_FILE", lg);
    }
  fout <<
    "</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableFullBuild</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.auto</key>\n"
    "\t\t\t\t\t<value>all</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableAutoBuild</key>\n"
    "\t\t\t\t\t<value>false</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.clean</key>\n"
    "\t\t\t\t\t<value>clean</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.fullBuildTarget</key>\n"
    "\t\t\t\t\t<value>all</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.buildArguments</key>\n"
    "\t\t\t\t\t<value></value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.location</key>\n"
    "\t\t\t\t\t<value>"
    << this->GetEclipsePath(this->HomeOutputDirectory) << "</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.autoBuildTarget</key>\n"
    "\t\t\t\t\t<value>all</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  // set error parsers
  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.core.errorOutputParser</key>\n"
    "\t\t\t\t\t<value>"
    ;
  if (compilerId == "MSVC")
    {
    fout << "org.eclipse.cdt.core.VCErrorParser;";
    }
  else if (compilerId == "Intel")
    {
    fout << "org.eclipse.cdt.core.ICCErrorParser;";
    }

  if (this->SupportsGmakeErrorParser)
    {
    fout << "org.eclipse.cdt.core.GmakeErrorParser;";
    }
  else
    {
    fout << "org.eclipse.cdt.core.MakeErrorParser;";
    }

  fout <<
    "org.eclipse.cdt.core.GCCErrorParser;"
    "org.eclipse.cdt.core.GASErrorParser;"
    "org.eclipse.cdt.core.GLDErrorParser;"
    "</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  fout <<
    "\t\t\t</arguments>\n"
    "\t\t</buildCommand>\n"
    "\t\t<buildCommand>\n"
    "\t\t\t<name>org.eclipse.cdt.make.core.ScannerConfigBuilder</name>\n"
    "\t\t\t<arguments>\n"
    "\t\t\t</arguments>\n"
    "\t\t</buildCommand>\n"
    "\t</buildSpec>\n"
    ;

  // set natures for c/c++ projects
  fout <<
    "\t<natures>\n"
    "\t\t<nature>org.eclipse.cdt.make.core.makeNature</nature>\n"
    "\t\t<nature>org.eclipse.cdt.make.core.ScannerConfigNature</nature>\n";

  for (std::set<std::string>::const_iterator nit=this->Natures.begin();
       nit != this->Natures.end(); ++nit)
    {
    fout << "\t\t<nature>" << *nit << "</nature>\n";
    }

  if (const char *extraNaturesProp = mf->GetState()
        ->GetGlobalProperty("ECLIPSE_EXTRA_NATURES"))
    {
    std::vector<std::string> extraNatures;
    cmSystemTools::ExpandListArgument(extraNaturesProp, extraNatures);
    for (std::vector<std::string>::const_iterator nit = extraNatures.begin();
         nit != extraNatures.end(); ++nit)
      {
      fout << "\t\t<nature>" << *nit << "</nature>\n";
      }
    }

  fout << "\t</natures>\n";

  fout << "\t<linkedResources>\n";
  // create linked resources
  if (this->IsOutOfSourceBuild)
    {
    // create a linked resource to CMAKE_SOURCE_DIR
    // (this is not done anymore for each project because of
    // http://public.kitware.com/Bug/view.php?id=9978 and because I found it
    // actually quite confusing in bigger projects with many directories and
    // projects, Alex

    std::string sourceLinkedResourceName = "[Source directory]";
    std::string linkSourceDirectory = this->GetEclipsePath(
                                             lg->GetCurrentSourceDirectory());
    // .project dir can't be subdir of a linked resource dir
    if (!cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                         linkSourceDirectory))
      {
      this->AppendLinkedResource(fout, sourceLinkedResourceName,
                                 this->GetEclipsePath(linkSourceDirectory),
                                 LinkToFolder);
      this->SrcLinkedResources.push_back(sourceLinkedResourceName);
      }

    }

  if (this->SupportsVirtualFolders)
    {
    this->CreateLinksToSubprojects(fout, this->HomeOutputDirectory);

    this->CreateLinksForTargets(fout);
    }

  fout << "\t</linkedResources>\n";

  fout << "</projectDescription>\n";
}